

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O1

void VW::move_feature_namespace(example *dst,example *src,namespace_index c)

{
  uchar *puVar1;
  ulong uVar2;
  features *pfVar3;
  long lVar4;
  features *pfVar5;
  long *plVar6;
  features *pfVar7;
  features *pfVar8;
  byte bVar9;
  features __tmp;
  byte local_79;
  long local_78 [12];
  float local_18;
  
  bVar9 = 0;
  local_79 = c;
  puVar1 = std::__find_if<unsigned_char*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                     ((src->super_example_predict).indices._begin,
                      (src->super_example_predict).indices._end,&local_79);
  if (puVar1 != (src->super_example_predict).indices._end) {
    puVar1 = std::__find_if<unsigned_char*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                       ((dst->super_example_predict).indices._begin,
                        (dst->super_example_predict).indices._end,&local_79);
    if (puVar1 == (dst->super_example_predict).indices._end) {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)dst,&local_79);
    }
    uVar2 = (ulong)local_79;
    pfVar3 = (dst->super_example_predict).feature_space + uVar2;
    pfVar8 = (src->super_example_predict).feature_space + uVar2;
    src->num_features =
         src->num_features -
         ((long)(src->super_example_predict).feature_space[uVar2].values._end -
          (long)(pfVar8->values)._begin >> 2);
    src->total_sum_feat_sq =
         src->total_sum_feat_sq - (src->super_example_predict).feature_space[uVar2].sum_feat_sq;
    pfVar5 = pfVar3;
    plVar6 = local_78;
    for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
      *plVar6 = (long)(pfVar5->values)._begin;
      pfVar5 = (features *)((long)pfVar5 + ((ulong)bVar9 * -2 + 1) * 8);
      plVar6 = plVar6 + (ulong)bVar9 * -2 + 1;
    }
    pfVar5 = pfVar8;
    pfVar7 = pfVar3;
    for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pfVar7->values)._begin = (pfVar5->values)._begin;
      pfVar5 = (features *)((long)pfVar5 + ((ulong)bVar9 * -2 + 1) * 8);
      pfVar7 = (features *)((long)pfVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    (dst->super_example_predict).feature_space[uVar2].sum_feat_sq =
         (src->super_example_predict).feature_space[uVar2].sum_feat_sq;
    plVar6 = local_78;
    for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pfVar8->values)._begin = (float *)*plVar6;
      plVar6 = plVar6 + (ulong)bVar9 * -2 + 1;
      pfVar8 = (features *)((long)pfVar8 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    (src->super_example_predict).feature_space[uVar2].sum_feat_sq = local_18;
    dst->num_features =
         dst->num_features +
         ((long)(dst->super_example_predict).feature_space[uVar2].values._end -
          (long)(pfVar3->values)._begin >> 2);
    dst->total_sum_feat_sq =
         (dst->super_example_predict).feature_space[uVar2].sum_feat_sq + dst->total_sum_feat_sq;
  }
  return;
}

Assistant:

void move_feature_namespace(example* dst, example* src, namespace_index c)
{
  if (std::find(src->indices.begin(), src->indices.end(), c) == src->indices.end())
    return;  // index not present in src
  if (std::find(dst->indices.begin(), dst->indices.end(), c) == dst->indices.end())
    dst->indices.push_back(c);

  auto& fdst = dst->feature_space[c];
  auto& fsrc = src->feature_space[c];

  src->num_features -= fsrc.size();
  src->total_sum_feat_sq -= fsrc.sum_feat_sq;
  std::swap(fdst, fsrc);
  dst->num_features += fdst.size();
  dst->total_sum_feat_sq += fdst.sum_feat_sq;
}